

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::DeadReckoningParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,DeadReckoningParameter *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Dead Reckoning Parameters:\n");
  poVar1 = std::operator<<(poVar1,"\tAlgorithm:            ");
  ENUMS::GetEnumAsStringDeadReckoningAlgorithm_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8DeadRecknoningAlgorithm,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tLinear Acceleration:  ");
  Vector::GetAsString_abi_cxx11_(&local_1e0,&this->m_LinearAcceleration);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tAngular Velocity:     ");
  Vector::GetAsString_abi_cxx11_(&local_200,&this->m_AngularVelocity);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString DeadReckoningParameter::GetAsString() const
{
    KStringStream ss;

    ss << "Dead Reckoning Parameters:\n"
       << "\tAlgorithm:            "   << GetEnumAsStringDeadReckoningAlgorithm( m_ui8DeadRecknoningAlgorithm )
       << "\n\tLinear Acceleration:  " << m_LinearAcceleration.GetAsString()
       << "\tAngular Velocity:     "   << m_AngularVelocity.GetAsString();

    return ss.str();
}